

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_sanitize_threed(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  size_t __size;
  uint uVar1;
  REF_DBL *metric;
  REF_DBL *metric_00;
  REF_DBL *metric_01;
  undefined8 uVar2;
  REF_STATUS RVar3;
  char *pcVar4;
  
  ref_node = ref_grid->node;
  uVar1 = ref_node->max;
  if ((int)uVar1 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x4c1,
           "ref_metric_sanitize_threed","malloc metric_orig of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    __size = (ulong)uVar1 * 0x30;
    metric = (REF_DBL *)malloc(__size);
    if (metric == (REF_DBL *)0x0) {
      pcVar4 = "malloc metric_orig of REF_DBL NULL";
      uVar2 = 0x4c1;
    }
    else {
      metric_00 = (REF_DBL *)malloc(__size);
      if (metric_00 == (REF_DBL *)0x0) {
        pcVar4 = "malloc metric_imply of REF_DBL NULL";
        uVar2 = 0x4c2;
      }
      else {
        metric_01 = (REF_DBL *)malloc(__size);
        if (metric_01 != (REF_DBL *)0x0) {
          uVar1 = ref_metric_from_node(metric,ref_node);
          if (uVar1 == 0) {
            uVar1 = ref_metric_imply_from(metric_00,ref_grid);
            if (uVar1 == 0) {
              uVar1 = ref_metric_smr(metric_00,metric,metric_01,ref_grid);
              if (uVar1 == 0) {
                uVar1 = ref_metric_imply_non_tet(metric_01,ref_grid);
                if (uVar1 == 0) {
                  uVar1 = ref_metric_to_node(metric_01,ref_grid->node);
                  if (uVar1 == 0) {
                    free(metric_01);
                    free(metric_00);
                    free(metric);
                    return 0;
                  }
                  pcVar4 = "to";
                  uVar2 = 0x4cd;
                }
                else {
                  pcVar4 = "imply non tet";
                  uVar2 = 0x4cb;
                }
              }
              else {
                pcVar4 = "smr";
                uVar2 = 0x4c9;
              }
            }
            else {
              pcVar4 = "imply";
              uVar2 = 0x4c7;
            }
          }
          else {
            pcVar4 = "from";
            uVar2 = 0x4c5;
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar2,"ref_metric_sanitize_threed",(ulong)uVar1,pcVar4);
          return uVar1;
        }
        pcVar4 = "malloc metric of REF_DBL NULL";
        uVar2 = 0x4c3;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar2,
           "ref_metric_sanitize_threed",pcVar4);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_sanitize_threed(REF_GRID ref_grid) {
  REF_DBL *metric_orig;
  REF_DBL *metric_imply;
  REF_DBL *metric;

  ref_malloc(metric_orig, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(metric, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  RSS(ref_metric_from_node(metric_orig, ref_grid_node(ref_grid)), "from");

  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  RSS(ref_metric_smr(metric_imply, metric_orig, metric, ref_grid), "smr");

  RSS(ref_metric_imply_non_tet(metric, ref_grid), "imply non tet");

  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "to");

  ref_free(metric);
  ref_free(metric_imply);
  ref_free(metric_orig);

  return REF_SUCCESS;
}